

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ExternalCommand::provideValue
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti,uintptr_t inputID,KeyType *key
          ,BuildValue *value)

{
  bool bVar1;
  size_type sVar2;
  reference ppBVar3;
  bool local_119;
  BuildKey local_110;
  BuildKey local_f0;
  undefined1 local_d0 [8];
  Optional<llbuild::buildsystem::BuildValue> skipValueForInput;
  anon_class_16_2_07425204 getSkipValueForInput;
  KeyType *key_local;
  uintptr_t inputID_local;
  BuildSystem *system_local;
  ExternalCommand *this_local;
  TaskInterface ti_local;
  
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x19])
            (this,system,ti.impl,ti.ctx,inputID,value);
  bVar1 = BuildValue::isSuccessfulCommand(value);
  if ((((!bVar1) && (bVar1 = BuildValue::isFailedCommand(value), !bVar1)) &&
      (bVar1 = BuildValue::isPropagatedFailureCommand(value), !bVar1)) &&
     (bVar1 = BuildValue::isCancelledCommand(value), !bVar1)) {
    bVar1 = BuildValue::hasMultipleOutputs(value);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!value.hasMultipleOutputs()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                    ,0x101,
                    "virtual void llbuild::buildsystem::ExternalCommand::provideValue(BuildSystem &, core::TaskInterface, uintptr_t, const core::KeyType &, const BuildValue &)"
                   );
    }
    bVar1 = BuildValue::isExistingInput(value);
    local_119 = true;
    if (!bVar1) {
      bVar1 = BuildValue::isMissingInput(value);
      local_119 = true;
      if (!bVar1) {
        bVar1 = BuildValue::isMissingOutput(value);
        local_119 = true;
        if (!bVar1) {
          bVar1 = BuildValue::isFailedInput(value);
          local_119 = true;
          if (!bVar1) {
            bVar1 = BuildValue::isVirtualInput(value);
            local_119 = true;
            if (!bVar1) {
              bVar1 = BuildValue::isSkippedCommand(value);
              local_119 = true;
              if (!bVar1) {
                bVar1 = BuildValue::isDirectoryTreeSignature(value);
                local_119 = true;
                if (!bVar1) {
                  bVar1 = BuildValue::isDirectoryTreeStructureSignature(value);
                  local_119 = true;
                  if (!bVar1) {
                    local_119 = BuildValue::isStaleFileRemoval(value);
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_119 == false) {
      __assert_fail("value.isExistingInput() || value.isMissingInput() || value.isMissingOutput() || value.isFailedInput() || value.isVirtualInput() || value.isSkippedCommand() || value.isDirectoryTreeSignature() || value.isDirectoryTreeStructureSignature() || value.isStaleFileRemoval()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                    ,0x107,
                    "virtual void llbuild::buildsystem::ExternalCommand::provideValue(BuildSystem &, core::TaskInterface, uintptr_t, const core::KeyType &, const BuildValue &)"
                   );
    }
    skipValueForInput.Storage._112_8_ = value;
    provideValue::anon_class_16_2_07425204::operator()
              ((Optional<llbuild::buildsystem::BuildValue> *)local_d0,
               (anon_class_16_2_07425204 *)&skipValueForInput.Storage.hasVal);
    bVar1 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue
                      ((Optional<llbuild::buildsystem::BuildValue> *)local_d0);
    if (bVar1) {
      llvm::Optional<llbuild::buildsystem::BuildValue>::operator=
                (&this->skipValue,(Optional<llbuild::buildsystem::BuildValue> *)local_d0);
      bVar1 = BuildValue::isMissingInput(value);
      if (bVar1) {
        sVar2 = std::
                vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                ::size(&(this->super_Command).inputs);
        if (inputID < sVar2) {
          ppBVar3 = std::
                    vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                    ::operator[](&(this->super_Command).inputs,inputID);
          BuildKey::makeNode(&local_f0,&(*ppBVar3)->super_Node);
          llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
                    ((SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
                     &this->missingInputKeys,&local_f0);
          BuildKey::~BuildKey(&local_f0);
        }
        else {
          BuildKey::fromData(&local_110,key);
          llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
                    ((SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *)
                     &this->missingInputKeys,&local_110);
          BuildKey::~BuildKey(&local_110);
        }
      }
    }
    else {
      bVar1 = BuildValue::isMissingOutput(value);
      if (bVar1) {
        this->canUpdateIfNewer = false;
      }
    }
    llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
              ((Optional<llbuild::buildsystem::BuildValue> *)local_d0);
  }
  return;
}

Assistant:

void ExternalCommand::provideValue(BuildSystem& system,
                                   core::TaskInterface ti,
                                   uintptr_t inputID,
                                   const core::KeyType& key,
                                   const BuildValue& value) {
  // Inform subclasses about the value
  provideValueExternalCommand(system, ti, inputID, value);
  
  if (value.isSuccessfulCommand() || value.isFailedCommand() || value.isPropagatedFailureCommand() || value.isCancelledCommand()) {
    // If the value is a successful command, it must probably be a value that was requested for a custom task, so
    // skip the input processing
    return;
  }

  // All direct inputs should be individual node values.
  assert(!value.hasMultipleOutputs());
  assert(value.isExistingInput() || value.isMissingInput() ||
         value.isMissingOutput() || value.isFailedInput() ||
         value.isVirtualInput()  || value.isSkippedCommand() ||
         value.isDirectoryTreeSignature() ||
         value.isDirectoryTreeStructureSignature() ||
         value.isStaleFileRemoval());

  // If the input should cause this command to skip, how should it skip?
  auto getSkipValueForInput = [&]() -> llvm::Optional<BuildValue> {
    // If the value is an signature, existing, or virtual input, we are always
    // good.
    if (value.isDirectoryTreeSignature() ||
        value.isDirectoryTreeStructureSignature() ||
        value.isExistingInput() ||
        value.isVirtualInput() || value.isStaleFileRemoval())
      return llvm::None;

    // We explicitly allow running the command against a missing output, under
    // the expectation that responsibility for reporting this situation falls to
    // the command.
    //
    // FIXME: Eventually, it might be nice to harden the format so that we know
    // when an output was actually required versus optional.
    if (value.isMissingOutput())
      return llvm::None;

    // If the value is a missing input, but those are allowed, it is ok.
    if (value.isMissingInput()) {
      if (allowMissingInputs)
        return llvm::None;
      else
        return BuildValue::makePropagatedFailureCommand();
    }

    // Propagate failure.
    if (value.isFailedInput())
      return BuildValue::makePropagatedFailureCommand();

    // A skipped dependency doesn't cause this command to skip.
    if (value.isSkippedCommand())
        return llvm::None;

    llvm_unreachable("unexpected input");
  };

  // Check if we need to skip the command because of this input.
  auto skipValueForInput = getSkipValueForInput();
  if (skipValueForInput.hasValue()) {
    skipValue = std::move(skipValueForInput);
    if (value.isMissingInput()) {
      if (inputs.size() > inputID) {
        missingInputKeys.push_back(BuildKey::makeNode(inputs[inputID]));
      } else {
        missingInputKeys.push_back(BuildKey::fromData(key));
      }
    }
  } else {
    // If there is a missing input file (from a successful command), we always
    // need to run the command.
    if (value.isMissingOutput())
      canUpdateIfNewer = false;
  }
}